

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturerecognizer.cpp
# Opt level: O3

void __thiscall QGestureRecognizer::reset(QGestureRecognizer *this,QGesture *gesture)

{
  long lVar1;
  
  if (gesture != (QGesture *)0x0) {
    lVar1 = *(long *)&gesture->field_0x8;
    *(undefined4 *)(lVar1 + 0x7c) = 0;
    *(undefined8 *)(lVar1 + 0x80) = 0;
    *(undefined8 *)(lVar1 + 0x88) = 0;
    *(undefined8 *)(lVar1 + 0x90) = 0;
    *(undefined8 *)(lVar1 + 0x98) = 0;
    *(byte *)(lVar1 + 0xa0) = *(byte *)(lVar1 + 0xa0) & 0xfe;
  }
  return;
}

Assistant:

void QGestureRecognizer::reset(QGesture *gesture)
{
    if (gesture) {
        QGesturePrivate *d = gesture->d_func();
        d->state = Qt::NoGesture;
        d->hotSpot = QPointF();
        d->sceneHotSpot = QPointF();
        d->isHotSpotSet = false;
    }
}